

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O2

cmd_ln_t * cmd_ln_parse_r(cmd_ln_t *inout_cmdln,arg_t *defn,int32 argc,char **argv,int strict)

{
  int32 iVar1;
  cmd_ln_t *cmdln;
  hash_table_t *h;
  arg_t *paVar2;
  hash_table_t *phVar3;
  cmd_ln_val_t *pcVar4;
  FILE *pFVar5;
  char *fmt;
  uint uVar6;
  long lVar7;
  uint size;
  char *pcVar8;
  undefined8 *puVar9;
  ulong uVar10;
  arg_t *val;
  void *v;
  long local_38;
  
  cmdln = inout_cmdln;
  if (inout_cmdln == (cmd_ln_t *)0x0) {
    cmdln = (cmd_ln_t *)
            __ckd_calloc__(1,0x20,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                           ,0x234);
    cmdln->refcount = 1;
  }
  size = 0;
  h = hash_table_new(0x32,0);
  if (defn != (arg_t *)0x0) {
    size = 0;
    for (val = defn; val->name != (char *)0x0; val = val + 1) {
      paVar2 = (arg_t *)hash_table_enter(h,val->name,val);
      if ((strict != 0) && (val != paVar2)) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                ,0x242,"Duplicate argument name in definition: %s\n",val->name);
        goto LAB_00109238;
      }
      size = size + 1;
    }
  }
  if (cmdln->ht == (hash_table_t *)0x0) {
    phVar3 = hash_table_new(size,0);
    cmdln->ht = phVar3;
  }
  if (argc < 1) {
    uVar10 = 0;
  }
  else {
    uVar10 = (ulong)(**argv != '-');
  }
  local_38 = (long)argc;
  for (lVar7 = uVar10 + 1; lVar7 + -1 < local_38; lVar7 = lVar7 + 2) {
    iVar1 = hash_table_lookup(h,argv[lVar7 + -1],&v);
    puVar9 = (undefined8 *)v;
    uVar6 = (uint)lVar7;
    if (iVar1 < 0) {
      if (strict != 0) {
        pcVar8 = argv[lVar7 + -1];
        fmt = "Unknown argument name \'%s\'\n";
        lVar7 = 0x25f;
LAB_00109222:
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                ,lVar7,fmt,pcVar8);
        goto LAB_00109238;
      }
      if (defn == (arg_t *)0x0) {
        v = (void *)0x0;
        if ((int)uVar6 < argc) goto LAB_00108f7a;
        goto LAB_0010905c;
      }
    }
    else {
      if (argc <= (int)uVar6) {
LAB_0010905c:
        cmd_ln_print_help_r(cmdln,_stderr,defn);
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                ,0x26c,"Argument value for \'%s\' missing\n",argv[lVar7 + -1]);
        goto LAB_00109238;
      }
      if (v == (void *)0x0) {
        uVar6 = (int)uVar10 + 1;
LAB_00108f7a:
        pcVar4 = cmd_ln_val_init(8,argv[lVar7 + -1],argv[uVar6]);
        puVar9 = (undefined8 *)0x0;
      }
      else {
        pcVar4 = cmd_ln_val_init(*(int *)((long)v + 8),argv[lVar7 + -1],argv[lVar7]);
        if (pcVar4 == (cmd_ln_val_t *)0x0) {
          cmd_ln_print_help_r(cmdln,_stderr,defn);
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                  ,0x276,"Bad argument value for %s: %s\n",argv[lVar7 + -1],argv[lVar7]);
          goto LAB_00109238;
        }
      }
      v = hash_table_enter(cmdln->ht,pcVar4->name,pcVar4);
      if ((cmd_ln_val_t *)v != pcVar4) {
        if (strict != 0) {
          cmd_ln_val_free(pcVar4);
          pcVar8 = (char *)*puVar9;
          fmt = "Duplicate argument name in arguments: %s\n";
          lVar7 = 0x281;
          goto LAB_00109222;
        }
        v = hash_table_replace(cmdln->ht,pcVar4->name,pcVar4);
        cmd_ln_val_free((cmd_ln_val_t *)v);
      }
    }
    uVar10 = uVar10 + 2;
  }
  lVar7 = 0;
  do {
    if ((ulong)size << 5 == lVar7) {
      for (lVar7 = 0; (ulong)size << 5 != lVar7; lVar7 = lVar7 + 0x20) {
        if (((*(byte *)((long)&defn->type + lVar7) & 1) != 0) &&
           (iVar1 = hash_table_lookup(cmdln->ht,*(char **)((long)&defn->name + lVar7),&v),
           iVar1 != 0)) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                  ,0x2a1,"Missing required argument %s\n",*(undefined8 *)((long)&defn->name + lVar7)
                 );
        }
      }
      if (argc == 1 && strict != 0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                ,0x2aa,"No arguments given, available options are:\n");
        cmd_ln_print_help_r(cmdln,_stderr,defn);
        if (h != (hash_table_t *)0x0) {
          hash_table_free(h);
        }
        if (inout_cmdln == (cmd_ln_t *)0x0) {
          cmd_ln_free_r(cmdln);
        }
        cmdln = (cmd_ln_t *)0x0;
      }
      else {
        pFVar5 = err_get_logfp();
        if (pFVar5 != (FILE *)0x0) {
          pFVar5 = err_get_logfp();
          cmd_ln_print_values_r(cmdln,pFVar5,defn);
        }
        hash_table_free(h);
      }
      return cmdln;
    }
    iVar1 = hash_table_lookup(cmdln->ht,*(char **)((long)&defn->name + lVar7),&v);
    if (iVar1 < 0) {
      pcVar4 = cmd_ln_val_init(*(int *)((long)&defn->type + lVar7),
                               *(char **)((long)&defn->name + lVar7),
                               *(char **)((long)&defn->deflt + lVar7));
      if (pcVar4 == (cmd_ln_val_t *)0x0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                ,0x294,"Bad default argument value for %s: %s\n",
                *(undefined8 *)((long)&defn->name + lVar7),
                *(undefined8 *)((long)&defn->deflt + lVar7));
LAB_00109238:
        if (h != (hash_table_t *)0x0) {
          hash_table_free(h);
        }
        if (inout_cmdln == (cmd_ln_t *)0x0) {
          cmd_ln_free_r(cmdln);
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                ,0x2bf,"Failed to parse arguments list\n");
        return (cmd_ln_t *)0x0;
      }
      hash_table_enter(cmdln->ht,pcVar4->name,pcVar4);
    }
    lVar7 = lVar7 + 0x20;
  } while( true );
}

Assistant:

cmd_ln_t *
cmd_ln_parse_r(cmd_ln_t *inout_cmdln, const arg_t * defn, int32 argc, char *argv[], int strict)
{
    int32 i, j, n, argstart;
    hash_table_t *defidx = NULL;
    cmd_ln_t *cmdln;

    /* Construct command-line object */
    if (inout_cmdln == NULL) {
        cmdln = (cmd_ln_t*)ckd_calloc(1, sizeof(*cmdln));
        cmdln->refcount = 1;
    }
    else
        cmdln = inout_cmdln;

    /* Build a hash table for argument definitions */
    defidx = hash_table_new(50, 0);
    if (defn) {
        for (n = 0; defn[n].name; n++) {
            void *v;

            v = hash_table_enter(defidx, defn[n].name, (void *)&defn[n]);
            if (strict && (v != &defn[n])) {
                E_ERROR("Duplicate argument name in definition: %s\n", defn[n].name);
                goto error;
            }
        }
    }
    else {
        /* No definitions. */
        n = 0;
    }

    /* Allocate memory for argument values */
    if (cmdln->ht == NULL)
        cmdln->ht = hash_table_new(n, 0 /* argument names are case-sensitive */ );


    /* skip argv[0] if it doesn't start with dash */
    argstart = 0;
    if (argc > 0 && argv[0][0] != '-') {
        argstart = 1;
    }

    /* Parse command line arguments (name-value pairs) */
    for (j = argstart; j < argc; j += 2) {
        arg_t *argdef;
        cmd_ln_val_t *val;
        void *v;

        if (hash_table_lookup(defidx, argv[j], &v) < 0) {
            if (strict) {
                E_ERROR("Unknown argument name '%s'\n", argv[j]);
                goto error;
            }
            else if (defn == NULL)
                v = NULL;
            else
                continue;
        }
        argdef = (arg_t *)v;

        /* Enter argument value */
        if (j + 1 >= argc) {
            cmd_ln_print_help_r(cmdln, stderr, defn);
            E_ERROR("Argument value for '%s' missing\n", argv[j]);
            goto error;
        }

        if (argdef == NULL)
            val = cmd_ln_val_init(ARG_STRING, argv[j], argv[j + 1]);
        else {
            if ((val = cmd_ln_val_init(argdef->type, argv[j], argv[j + 1])) == NULL) {
                cmd_ln_print_help_r(cmdln, stderr, defn);
                E_ERROR("Bad argument value for %s: %s\n", argv[j],
                        argv[j + 1]);
                goto error;
            }
        }

        if ((v = hash_table_enter(cmdln->ht, val->name, (void *)val)) !=
            (void *)val)
        {
            if (strict) {
                cmd_ln_val_free(val);
                E_ERROR("Duplicate argument name in arguments: %s\n",
                        argdef->name);
                goto error;
            }
            else {
                v = hash_table_replace(cmdln->ht, val->name, (void *)val);
                cmd_ln_val_free((cmd_ln_val_t *)v);
            }
        }
    }

    /* Fill in default values, if any, for unspecified arguments */
    for (i = 0; i < n; i++) {
        cmd_ln_val_t *val;
        void *v;

        if (hash_table_lookup(cmdln->ht, defn[i].name, &v) < 0) {
            if ((val = cmd_ln_val_init(defn[i].type, defn[i].name, defn[i].deflt)) == NULL) {
                E_ERROR
                    ("Bad default argument value for %s: %s\n",
                     defn[i].name, defn[i].deflt);
                goto error;
            }
            hash_table_enter(cmdln->ht, val->name, (void *)val);
        }
    }

    /* Check for required arguments; exit if any missing */
    j = 0;
    for (i = 0; i < n; i++) {
        if (defn[i].type & ARG_REQUIRED) {
            void *v;
            if (hash_table_lookup(cmdln->ht, defn[i].name, &v) != 0)
                E_ERROR("Missing required argument %s\n", defn[i].name);
        }
    }
    if (j > 0) {
        cmd_ln_print_help_r(cmdln, stderr, defn);
        goto error;
    }

    if (strict && argc == 1) {
        E_ERROR("No arguments given, available options are:\n");
        cmd_ln_print_help_r(cmdln, stderr, defn);
        if (defidx)
            hash_table_free(defidx);
        if (inout_cmdln == NULL)
            cmd_ln_free_r(cmdln);
        return NULL;
    }

    /* Print current values always in SphinxTrain */
    if (err_get_logfp())
	cmd_ln_print_values_r(cmdln, err_get_logfp(), defn);

    hash_table_free(defidx);
    return cmdln;

  error:
    if (defidx)
        hash_table_free(defidx);
    if (inout_cmdln == NULL)
        cmd_ln_free_r(cmdln);
    E_ERROR("Failed to parse arguments list\n");
    return NULL;
}